

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  float afStack_3c [5];
  undefined4 local_28;
  float fStack_24;
  undefined4 uStack_20;
  float fStack_1c;
  int aiStack_18 [6];
  
  auVar8 = *(undefined1 (*) [16])evalCtx->in[0].m_data;
  uVar4 = auVar8._0_4_;
  uVar5 = auVar8._4_4_;
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  uVar6 = (undefined4)uVar1;
  uVar7 = (undefined4)((ulong)uVar1 >> 0x20);
  auVar8._8_4_ = uVar6;
  auVar8._12_4_ = uVar7;
  if (in0Type != INPUTTYPE_DYNAMIC) {
    auVar8 = _DAT_00af0dc0;
  }
  if (in1Type != INPUTTYPE_DYNAMIC) {
    uVar4 = 0x3f4ccccd;
    uVar5 = 0x3f000000;
    uVar6 = 0x3dcccccd;
    uVar7 = 0xbf666666;
  }
  auVar2._4_4_ = uVar5;
  auVar2._0_4_ = uVar4;
  auVar2._8_4_ = uVar6;
  auVar2._12_4_ = uVar7;
  auVar8 = divps(auVar8,auVar2);
  uStack_20 = auVar8._8_4_;
  fStack_24 = auVar8._4_4_;
  fStack_1c = auVar8._12_4_;
  local_28 = auVar8._0_4_;
  afStack_3c[2] = (float)local_28;
  afStack_3c[3] = (float)uStack_20;
  afStack_3c[4] = fStack_24 + fStack_1c;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = afStack_3c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}